

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_fast_class_base_declarations(writer *w,TypeDef *type)

{
  bool bVar1;
  TypeDef *in_RCX;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> local_e8;
  type *local_c8;
  type *info;
  type *name;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
  local_b0;
  iterator __end2;
  iterator __begin2;
  get_interfaces_t *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  char *local_60;
  char *format;
  TypeDef *base;
  __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  local_48;
  iterator __end1;
  iterator __begin1;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *__range1;
  TypeDef *type_local;
  writer *w_local;
  
  get_bases((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)&__begin1,
            type);
  __end1 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::begin
                     ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                      &__begin1);
  local_48._M_current =
       (TypeDef *)
       std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::end
                 ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                  &__begin1);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_48);
    if (!bVar1) {
      base._4_4_ = 2;
      std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::~vector
                ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                 &__begin1);
      return;
    }
    format = (char *)__gnu_cxx::
                     __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                     ::operator*(&__end1);
    local_60 = "        operator impl::producer_ref<%> const() const noexcept;\n";
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,"        operator impl::producer_ref<%> const() const noexcept;\n");
    writer_base<cppwinrt::writer>::write<winmd::reader::TypeDef>
              (&w->super_writer_base<cppwinrt::writer>,&local_70,(TypeDef *)format);
    get_interfaces_abi_cxx11_((get_interfaces_t *)&__begin2,(cppwinrt *)w,(writer *)format,in_RCX);
    __end2 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                      *)&__begin2);
    local_b0._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                   *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_b0), bVar1) {
      name = &__gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
              ::operator*(&__end2)->first;
      info = (type *)::std::get<0ul,std::__cxx11::string,cppwinrt::interface_info>
                               ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                                 *)name);
      local_c8 = ::std::get<1ul,std::__cxx11::string,cppwinrt::interface_info>
                           ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                             *)name);
      if ((local_c8->fastabi & 1U) == 0) break;
      winmd::reader::TypeDef::MethodList(&local_e8,&local_c8->type);
      writer_base<cppwinrt::writer>::
      write_each<&cppwinrt::write_consume_declaration,_std::pair<winmd::reader::MethodDef,_winmd::reader::MethodDef>_>
                (&w->super_writer_base<cppwinrt::writer>,&local_e8);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
      ::operator++(&__end2);
    }
    base._4_4_ = 4;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
               *)&__begin2);
    __gnu_cxx::
    __normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

static void write_fast_class_base_declarations(writer& w, TypeDef const& type)
    {
        for (auto&& base : get_bases(type))
        {
            auto format = R"(        operator impl::producer_ref<%> const() const noexcept;
)";

            w.write(format, base);

            for (auto&& [name, info] : get_interfaces(w, base))
            {
                if (!info.fastabi)
                {
                    break;
                }

                w.write_each<write_consume_declaration>(info.type.MethodList());
            }
        }
    }